

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall MipsParser::decodeVfpuType(MipsParser *this,string *name,size_t *pos,int *dest)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 *puVar3;
  int *dest_local;
  size_t *pos_local;
  string *name_local;
  MipsParser *this_local;
  
  uVar1 = *pos;
  uVar2 = std::__cxx11::string::size();
  if (uVar1 < uVar2) {
    *pos = *pos + 1;
    puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)name);
    switch(*puVar3) {
    case 0x70:
      *dest = 1;
      this_local._7_1_ = true;
      break;
    case 0x71:
      *dest = 3;
      this_local._7_1_ = true;
      break;
    default:
      *pos = *pos - 1;
      this_local._7_1_ = false;
      break;
    case 0x73:
      *dest = 0;
      this_local._7_1_ = true;
      break;
    case 0x74:
      *dest = 2;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MipsParser::decodeVfpuType(const std::string& name, size_t& pos, int& dest)
{
	if (pos >= name.size())
		return false;

	switch (name[pos++])
	{
	case 's':
		dest = 0;
		return true;
	case 'p':
		dest = 1;
		return true;
	case 't':
		dest = 2;
		return true;
	case 'q':
		dest = 3;
		return true;
	}

	pos--;
	return false;
}